

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_refcount.c
# Opt level: O2

void uo_refcount_dec(uo_refcount *refcount)

{
  atomic_uint_fast32_t *paVar1;
  long *in_FS_OFFSET;
  
  LOCK();
  paVar1 = &refcount->count;
  *paVar1 = *paVar1 - 1;
  UNLOCK();
  if (*paVar1 == 0) {
    (*refcount->finalizer)(refcount->ptr);
    uo__linklist_link((uo_linklist *)(*in_FS_OFFSET + -0x10),(uo_linklist *)&refcount[-1].finalizer)
    ;
    return;
  }
  return;
}

Assistant:

void uo_refcount_dec(
    uo_refcount *refcount)
{
    if (atomic_fetch_sub(&refcount->count, 1) == 1)
    {
        refcount->finalizer(refcount->ptr);
        uo_refcount_linkpool_return(uo_refcount_get_linklist(refcount));
    }
}